

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::isColorRenderableFormat(GLenum internalFormat)

{
  undefined1 local_d;
  GLenum internalFormat_local;
  
  local_d = true;
  if (((((((internalFormat != 0x8d62) && (local_d = true, internalFormat != 0x8056)) &&
         (local_d = true, internalFormat != 0x8057)) &&
        ((local_d = true, internalFormat != 0x8059 && (local_d = true, internalFormat != 0x906f))))
       && (local_d = true, internalFormat != 0x8c43)) &&
      (((((local_d = true, internalFormat != 0x8229 && (local_d = true, internalFormat != 0x822b))
         && ((local_d = true, internalFormat != 0x8051 &&
             (((local_d = true, internalFormat != 0x8058 &&
               (local_d = true, internalFormat != 0x8231)) &&
              (local_d = true, internalFormat != 0x8237)))))) &&
        (((local_d = true, internalFormat != 0x8d8e && (local_d = true, internalFormat != 0x8232))
         && ((local_d = true, internalFormat != 0x8238 &&
             ((((local_d = true, internalFormat != 0x8d7c &&
                (local_d = true, internalFormat != 0x8233)) &&
               ((local_d = true, internalFormat != 0x8239 &&
                (((local_d = true, internalFormat != 0x8d88 &&
                  (local_d = true, internalFormat != 0x8234)) &&
                 (local_d = true, internalFormat != 0x823a)))))) &&
              ((local_d = true, internalFormat != 0x8d76 &&
               (local_d = true, internalFormat != 0x8235)))))))))) &&
       (local_d = true, internalFormat != 0x823b)))) &&
     (((local_d = true, internalFormat != 0x8d82 && (local_d = true, internalFormat != 0x8236)) &&
      (local_d = true, internalFormat != 0x823c)))) {
    local_d = internalFormat == 0x8d70;
  }
  return local_d;
}

Assistant:

static bool isColorRenderableFormat (glw::GLenum internalFormat)
{
	return	internalFormat == GL_RGB565			||
			internalFormat == GL_RGBA4			||
			internalFormat == GL_RGB5_A1		||
			internalFormat == GL_RGB10_A2		||
			internalFormat == GL_RGB10_A2UI		||
			internalFormat == GL_SRGB8_ALPHA8	||
			internalFormat == GL_R8				||
			internalFormat == GL_RG8			||
			internalFormat == GL_RGB8			||
			internalFormat == GL_RGBA8			||
			internalFormat == GL_R8I			||
			internalFormat == GL_RG8I			||
			internalFormat == GL_RGBA8I			||
			internalFormat == GL_R8UI			||
			internalFormat == GL_RG8UI			||
			internalFormat == GL_RGBA8UI		||
			internalFormat == GL_R16I			||
			internalFormat == GL_RG16I			||
			internalFormat == GL_RGBA16I		||
			internalFormat == GL_R16UI			||
			internalFormat == GL_RG16UI			||
			internalFormat == GL_RGBA16UI		||
			internalFormat == GL_R32I			||
			internalFormat == GL_RG32I			||
			internalFormat == GL_RGBA32I		||
			internalFormat == GL_R32UI			||
			internalFormat == GL_RG32UI			||
			internalFormat == GL_RGBA32UI;
}